

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

int X509V3_add_value_int(char *name,ASN1_INTEGER *aint,stack_st_CONF_VALUE **extlist)

{
  int iVar1;
  char *__s;
  size_t value_len;
  
  if (aint == (ASN1_INTEGER *)0x0) {
    iVar1 = 1;
  }
  else {
    __s = i2s_ASN1_INTEGER((X509V3_EXT_METHOD *)name,aint);
    if (__s == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      value_len = strlen(__s);
      iVar1 = x509V3_add_len_value(name,__s,value_len,0,(stack_st_CONF_VALUE **)extlist);
      OPENSSL_free(__s);
    }
  }
  return iVar1;
}

Assistant:

int X509V3_add_value_int(const char *name, const ASN1_INTEGER *aint,
                         STACK_OF(CONF_VALUE) **extlist) {
  char *strtmp;
  int ret;
  if (!aint) {
    return 1;
  }
  if (!(strtmp = i2s_ASN1_INTEGER(NULL, aint))) {
    return 0;
  }
  ret = X509V3_add_value(name, strtmp, extlist);
  OPENSSL_free(strtmp);
  return ret;
}